

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextstream.cpp
# Opt level: O0

bool __thiscall QTextStream::readLineInto(QTextStream *this,QString *line,qint64 maxlen)

{
  bool bVar1;
  QTextStreamPrivate *this_00;
  QChar *in_RDX;
  QString *in_RSI;
  long in_FS_OFFSET;
  qsizetype unaff_retaddr;
  QTextStreamPrivate *d;
  qsizetype length;
  QChar *readPtr;
  undefined7 in_stack_ffffffffffffff98;
  undefined1 in_stack_ffffffffffffff9f;
  bool local_39;
  long lVar2;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = d_func((QTextStream *)0x13f96f);
  if ((this_00->string == (QString *)0x0) && (this_00->device == (QIODevice *)0x0)) {
    if ((in_RSI != (QString *)0x0) && (bVar1 = QString::isNull((QString *)0x13f9c6), !bVar1)) {
      QString::resize((QString *)this_00,
                      CONCAT17(in_stack_ffffffffffffff9f,in_stack_ffffffffffffff98));
    }
    local_39 = false;
  }
  else {
    bVar1 = QTextStreamPrivate::scan
                      ((QTextStreamPrivate *)line,(QChar **)maxlen,(qsizetype *)d,unaff_retaddr,
                       (TokenDelimiter)((ulong)lVar2 >> 0x20));
    if (bVar1) {
      if (in_RSI != (QString *)0x0) {
        QString::setUnicode(in_RSI,in_RDX,(qsizetype)this_00);
      }
      QTextStreamPrivate::consumeLastToken(this_00);
      local_39 = true;
    }
    else {
      if ((in_RSI != (QString *)0x0) && (bVar1 = QString::isNull((QString *)0x13fa35), !bVar1)) {
        QString::resize((QString *)this_00,
                        CONCAT17(in_stack_ffffffffffffff9f,in_stack_ffffffffffffff98));
      }
      local_39 = false;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return local_39;
  }
  __stack_chk_fail();
}

Assistant:

bool QTextStream::readLineInto(QString *line, qint64 maxlen)
{
    Q_D(QTextStream);
    // keep in sync with CHECK_VALID_STREAM
    if (!d->string && !d->device) {
        qWarning("QTextStream: No device");
        if (line && !line->isNull())
            line->resize(0);
        return false;
    }

    const QChar *readPtr;
    qsizetype length;
    if (!d->scan(&readPtr, &length, qsizetype(maxlen), QTextStreamPrivate::EndOfLine)) {
        if (line && !line->isNull())
            line->resize(0);
        return false;
    }

    if (Q_LIKELY(line))
        line->setUnicode(readPtr, length);
    d->consumeLastToken();
    return true;
}